

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<capnp::Orphan<capnp::compiler::Statement>_>::Maybe
          (Maybe<capnp::Orphan<capnp::compiler::Statement>_> *this,
          Maybe<capnp::Orphan<capnp::compiler::Statement>_> *other)

{
  CapTableBuilder *pCVar1;
  byte bVar2;
  
  bVar2 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar2;
  if ((bool)bVar2 == true) {
    pCVar1 = (other->ptr).field_1.value.builder.capTable;
    (this->ptr).field_1.value.builder.segment = (other->ptr).field_1.value.builder.segment;
    (this->ptr).field_1.value.builder.capTable = pCVar1;
    (this->ptr).field_1.value.builder.location = (other->ptr).field_1.value.builder.location;
    (this->ptr).field_1.value.builder.tag.content = (other->ptr).field_1.value.builder.tag.content;
    (other->ptr).field_1.value.builder.segment = (SegmentBuilder *)0x0;
    (other->ptr).field_1.value.builder.location = (word *)0x0;
    bVar2 = (other->ptr).isSet;
  }
  if (((bVar2 & 1) != 0) &&
     ((other->ptr).isSet = false,
     (other->ptr).field_1.value.builder.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&(other->ptr).field_1.value.builder);
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }